

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O1

void msdfgen::generateSDF_legacy
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  uint y;
  bool bVar1;
  int iVar2;
  EdgeSegment *pEVar3;
  float *pfVar4;
  pointer pCVar5;
  EdgeHolder *this;
  int x;
  double extraout_XMM0_Qa;
  double dVar6;
  Vector2 VVar7;
  SignedDistance a;
  double dummy;
  double local_b0;
  SignedDistance local_a0;
  uint local_90;
  uint local_8c;
  Bitmap<float> *local_88;
  double local_80;
  Vector2 *local_78;
  Vector2 *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  Vector2 local_40;
  
  local_80 = range;
  local_78 = scale;
  local_70 = translate;
  iVar2 = Bitmap<float>::width(output);
  local_88 = output;
  local_90 = Bitmap<float>::height(output);
  if (0 < (int)local_90) {
    local_8c = 0;
    local_b0 = 0.0;
    do {
      y = ~local_8c + local_90;
      if (shape->inverseYAxis == false) {
        y = local_8c;
      }
      if (0 < iVar2) {
        local_68 = local_b0 + 0.5;
        x = 0;
        local_60 = 0.0;
        do {
          Vector2::Vector2(&local_40,local_60 + 0.5,local_68);
          local_a0 = (SignedDistance)Vector2::operator/(&local_40,local_78);
          VVar7 = Vector2::operator-((Vector2 *)&local_a0,local_70);
          local_58 = VVar7.y;
          local_50 = VVar7.x;
          SignedDistance::SignedDistance(&local_a0);
          for (pCVar5 = (shape->contours).
                        super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pCVar5 != (shape->contours).
                        super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
            for (this = (pCVar5->edges).
                        super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                this != (pCVar5->edges).
                        super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                        ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
              pEVar3 = EdgeHolder::operator->(this);
              dVar6 = local_58;
              (*pEVar3->_vptr_EdgeSegment[5])(local_50,pEVar3,&local_40);
              a.dot = dVar6;
              a.distance = extraout_XMM0_Qa;
              local_48 = dVar6;
              bVar1 = operator<(a,local_a0);
              if (bVar1) {
                local_a0.dot = local_48;
                local_a0.distance = extraout_XMM0_Qa;
              }
            }
          }
          dVar6 = local_a0.distance / local_80;
          pfVar4 = Bitmap<float>::operator()(local_88,x,y);
          *pfVar4 = (float)(dVar6 + 0.5);
          local_60 = local_60 + 1.0;
          x = x + 1;
        } while (x != iVar2);
      }
      local_b0 = local_b0 + 1.0;
      local_8c = local_8c + 1;
    } while (local_8c != local_90);
  }
  return;
}

Assistant:

void generateSDF_legacy(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int w = output.width(), h = output.height();
#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel for
#endif
    for (int y = 0; y < h; ++y) {
        int row = shape.inverseYAxis ? h-y-1 : y;
        for (int x = 0; x < w; ++x) {
            double dummy;
            Point2 p = Vector2(x+.5, y+.5)/scale-translate;
            SignedDistance minDistance;
            for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
                for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                    SignedDistance distance = (*edge)->signedDistance(p, dummy);
                    if (distance < minDistance)
                        minDistance = distance;
                }
            output(x, row) = float(minDistance.distance/range+.5);
        }
    }
}